

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O2

int avl_insert(avl_tree *tree,avl_node *new)

{
  list_entity *plVar1;
  int iVar2;
  avl_node *last;
  avl_node *paVar3;
  int local_1c;
  
  new->balance = '\0';
  new->follower = false;
  new->right = (avl_node *)0x0;
  new->parent = (avl_node *)0x0;
  new->left = (avl_node *)0x0;
  if (tree->root == (avl_node *)0x0) {
    plVar1 = (tree->list_head).next;
    (new->list).next = plVar1;
    (new->list).prev = &tree->list_head;
    plVar1->prev = &new->list;
    (tree->list_head).next = &new->list;
    tree->root = new;
    tree->count = 1;
  }
  else {
    last = _avl_find_rec(tree->root,new->key,tree->comp,&local_1c);
    iVar2 = (*tree->comp)(new->key,last->key);
    if (iVar2 == 0) {
      if (tree->allow_dups != true) {
        return -1;
      }
      new->follower = true;
      plVar1 = (last->list).next;
      (new->list).next = plVar1;
      (new->list).prev = &last->list;
      plVar1->prev = &new->list;
      (last->list).next = &new->list;
      tree->count = tree->count + 1;
    }
    else {
      new->parent = last;
      if (last->balance == -1) {
        paVar3 = _avl_find_last(tree,last);
        plVar1 = (paVar3->list).next;
        (new->list).next = plVar1;
        (new->list).prev = &paVar3->list;
        plVar1->prev = &new->list;
        (paVar3->list).next = &new->list;
        tree->count = tree->count + 1;
        last->balance = '\0';
        last->right = new;
      }
      else if (last->balance == '\x01') {
        plVar1 = (last->list).prev;
        (new->list).next = &last->list;
        (new->list).prev = plVar1;
        (last->list).prev = &new->list;
        plVar1->next = &new->list;
        tree->count = tree->count + 1;
        last->balance = '\0';
        last->left = new;
      }
      else {
        if (iVar2 < 0) {
          plVar1 = (last->list).prev;
          (new->list).next = &last->list;
          (new->list).prev = plVar1;
          (last->list).prev = &new->list;
          plVar1->next = &new->list;
          tree->count = tree->count + 1;
          last->balance = -1;
          last->left = new;
        }
        else {
          paVar3 = _avl_find_last(tree,last);
          plVar1 = (paVar3->list).next;
          (new->list).next = plVar1;
          (new->list).prev = &paVar3->list;
          plVar1->prev = &new->list;
          (paVar3->list).next = &new->list;
          tree->count = tree->count + 1;
          last->balance = '\x01';
          last->right = new;
        }
        _post_insert(tree,last);
      }
    }
  }
  return 0;
}

Assistant:

int
avl_insert(struct avl_tree *tree, struct avl_node *new) {
  struct avl_node *node, *last;
  int diff;

  new->parent = NULL;

  new->left = NULL;
  new->right = NULL;

  new->balance = 0;
  new->follower = false;

  if (tree->root == NULL) {
    list_add_head(&tree->list_head, &new->list);
    tree->root = new;
    tree->count = 1;
    return 0;
  }

  node = _avl_find_rec(tree->root, new->key, tree->comp, &diff);

  diff = (*tree->comp)(new->key, node->key);

  if (diff == 0) {
    if (!tree->allow_dups)
      return -1;

    new->follower = true;

    /* add new node outside the tree, because key is already present */
    _avl_insert_after(tree, node, new);
    return 0;
  }

  new->parent = node;

  if (node->balance == 1) {
    _avl_insert_before(tree, node, new);
    node->balance = 0;
    node->left = new;
    return 0;
  }

  if (node->balance == -1) {
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 0;
    node->right = new;
    return 0;
  }

  if (diff < 0) {
    _avl_insert_before(tree, node, new);

    node->balance = -1;
    node->left = new;
    _post_insert(tree, node);
  }
  else { /* diff > 0 */
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 1;
    node->right = new;
    _post_insert(tree, node);
  }
  return 0;
}